

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

Declaration * __thiscall
CPP::WriteInitialization::findDeclaration(WriteInitialization *this,QString *name)

{
  DomWidget *this_00;
  DomAction *pDVar1;
  Driver *this_01;
  DomAction *in_RSI;
  Declaration *in_RDI;
  long in_FS_OFFSET;
  DomButtonGroup *group;
  DomAction *action;
  DomWidget *widget;
  char16_t *str;
  char16_t *str_1;
  DomWidget *in_stack_ffffffffffffff38;
  Driver *in_stack_ffffffffffffff40;
  QArrayDataPointer<char16_t> *this_02;
  Driver *in_stack_ffffffffffffff68;
  DomWidget *in_stack_ffffffffffffff70;
  QArrayDataPointer<char16_t> local_38;
  QArrayDataPointer<char16_t> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = Driver::widgetByName(in_stack_ffffffffffffff40,&in_stack_ffffffffffffff38->m_attr_class)
  ;
  if (this_00 == (DomWidget *)0x0) {
    pDVar1 = Driver::actionByName
                       (in_stack_ffffffffffffff40,&in_stack_ffffffffffffff38->m_attr_class);
    if (pDVar1 == (DomAction *)0x0) {
      this_01 = (Driver *)
                Driver::findButtonGroup
                          (in_stack_ffffffffffffff40,&in_stack_ffffffffffffff38->m_attr_class);
      if (this_01 == (Driver *)0x0) {
        QString::QString((QString *)0x141b65);
        QString::QString((QString *)0x141b73);
      }
      else {
        Driver::findOrInsertButtonGroup(this_01,(DomButtonGroup *)in_RSI);
        this_02 = &(in_RDI->className).d;
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_38,(Data *)0x0,L"QButtonGroup",0xc);
        QString::QString((QString *)this_02,(DataPointer *)in_stack_ffffffffffffff38);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(this_02);
      }
    }
    else {
      Driver::findOrInsertAction(in_stack_ffffffffffffff68,in_RSI);
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_20,(Data *)0x0,L"QAction",7);
      QString::QString((QString *)in_stack_ffffffffffffff40,(DataPointer *)in_stack_ffffffffffffff38
                      );
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)in_stack_ffffffffffffff40);
    }
  }
  else {
    Driver::findOrInsertWidget((Driver *)this_00,in_stack_ffffffffffffff70);
    DomWidget::attributeClass(in_stack_ffffffffffffff38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

WriteInitialization::Declaration WriteInitialization::findDeclaration(const QString &name)
{
    if (const DomWidget *widget = m_driver->widgetByName(name))
        return {m_driver->findOrInsertWidget(widget), widget->attributeClass()};
    if (const DomAction *action = m_driver->actionByName(name))
        return {m_driver->findOrInsertAction(action), QStringLiteral("QAction")};
    if (const DomButtonGroup *group = m_driver->findButtonGroup(name))
         return {m_driver->findOrInsertButtonGroup(group), QStringLiteral("QButtonGroup")};
    return {};
}